

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::unsafe> *timer)

{
  reference_counter_type *prVar1;
  size_t *psVar2;
  int iVar3;
  timer_type *ptVar4;
  timer_type *ptVar5;
  timer_type *ptVar6;
  timer_type **pptVar7;
  timer_type **pptVar8;
  
  ptVar6 = timer_object_holder<timertt::thread_safety::unsafe>::
           cast_to<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                     (timer);
  iVar3 = *(int *)&(ptVar6->super_timer_object<timertt::thread_safety::unsafe>).field_0xc;
  if (iVar3 == 2) {
    *(undefined4 *)&(ptVar6->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 3;
  }
  else if (iVar3 == 1) {
    ptVar4 = ptVar6->m_prev;
    ptVar5 = ptVar6->m_next;
    pptVar7 = &ptVar4->m_next;
    if (ptVar4 == (timer_type *)0x0) {
      pptVar7 = &this->m_head;
    }
    pptVar8 = &ptVar5->m_prev;
    if (ptVar5 == (timer_type *)0x0) {
      pptVar8 = &this->m_tail;
    }
    *pptVar7 = ptVar5;
    *pptVar8 = ptVar4;
    psVar2 = &(this->
              super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              ).m_timer_quantities.m_single_shot_count + ((ptVar6->m_period).__r != 0);
    *psVar2 = *psVar2 - 1;
    *(undefined4 *)&(ptVar6->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    prVar1 = &(ptVar6->super_timer_object<timertt::thread_safety::unsafe>).m_references;
    *prVar1 = *prVar1 - 1;
    if (*prVar1 == 0) {
      (*(ptVar6->super_timer_object<timertt::thread_safety::unsafe>)._vptr_timer_object[1])(ptVar6);
      return;
    }
  }
  return;
}

Assistant:

void
	deactivate(
		//! Timer to be deactivated.
		timer_object_holder< THREAD_SAFETY > timer )
	{
		auto list_timer = timer.template cast_to< timer_type >();
		if( timer_status::active == list_timer->m_status )
		{
			// This is normal active timer. It can be safely
			// deactivated and destroyed.
			remove_timer_from_list( list_timer );
			// Count of timers in the list changed.
			this->dec_timer_count( list_timer->kind() );

			list_timer->m_status = timer_status::deactivated;

			// Release timer object.
			timer_object< THREAD_SAFETY >::decrement_references( list_timer );
		}
		else if( timer_status::wait_for_execution == list_timer->m_status )
		{
			// This timer is in execution list right now.
			// We can only change its status.
			// Final deactivation will be done after execution of
			// timers actions.
			list_timer->m_status = timer_status::wait_for_deactivation;
		}
	}